

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O1

econf_err setDoubleValueNum(econf_file *ef,size_t num,void *v)

{
  char *__ptr;
  int iVar1;
  econf_err eVar2;
  char *in_RAX;
  char *ptr;
  char *local_18;
  
  local_18 = in_RAX;
  iVar1 = asprintf(&local_18,"%.*g",*v,0x11);
  if (iVar1 == -1) {
    eVar2 = ECONF_NOMEM;
  }
  else {
    __ptr = ef->file_entry[num].value;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    ef->file_entry[num].value = local_18;
    eVar2 = ECONF_SUCCESS;
  }
  return eVar2;
}

Assistant:

econf_err setStringValueNum(econf_file *ef, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : "");
  char *ptr;

  if ((ptr = strdup (value)) == NULL)
    return ECONF_NOMEM;

  if (ef->file_entry[num].value)
    free(ef->file_entry[num].value);

  ef->file_entry[num].value = ptr;

  return ECONF_SUCCESS;
}